

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

int Ssw_ManSweepBmcConstr_old(Ssw_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Ssw_Pars_t *pSVar7;
  abctime aVar8;
  char *pString;
  int iVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  int i;
  int iVar12;
  Bar_Progress_t *local_40;
  
  aVar2 = Abc_Clock();
  pAVar3 = Aig_ManStart(p->pPars->nFramesK * p->pAig->vObjs->nSize);
  p->pFrames = pAVar3;
  for (iVar9 = 0; pAVar3 = p->pAig, iVar9 < pAVar3->nRegs; iVar9 = iVar9 + 1) {
    pvVar4 = Vec_PtrEntry(pAVar3->vCis,pAVar3->nTruePis + iVar9);
    p->pNodeToFrames[(long)*(int *)((long)pvVar4 + 0x24) * (long)p->nFrames] =
         (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1);
  }
  iVar12 = 0;
  iVar9 = 0;
  while( true ) {
    iVar11 = p->pPars->nFramesK;
    if (iVar11 <= iVar12) break;
    p->pNodeToFrames[pAVar3->pConst1->Id * p->nFrames + iVar12] = p->pFrames->pConst1;
    iVar11 = 0;
    while( true ) {
      pAVar3 = p->pAig;
      if (pAVar3->nTruePis <= iVar11) break;
      pvVar4 = Vec_PtrEntry(pAVar3->vCis,iVar11);
      pAVar5 = Aig_ObjCreateCi(p->pFrames);
      uVar1 = Vec_IntEntry(p->vInits,iVar9 + iVar11);
      *(ulong *)&pAVar5->field_0x18 =
           (*(ulong *)&pAVar5->field_0x18 & 0xfffffffffffffff7) + (ulong)(uVar1 & 1) * 8;
      p->pNodeToFrames[*(int *)((long)pvVar4 + 0x24) * p->nFrames + iVar12] = pAVar5;
      iVar11 = iVar11 + 1;
    }
    for (i = 0; i < pAVar3->nTruePos; i = i + 1) {
      pvVar4 = Vec_PtrEntry(pAVar3->vCos,i);
      if (p->pAig->nTruePos - p->pAig->nConstrs <= i) {
        pAVar6 = Ssw_ManSweepBmcConstr_rec
                           (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe),
                            iVar12);
        pAVar10 = (Aig_Obj_t *)
                  ((ulong)((uint)*(undefined8 *)((long)pvVar4 + 8) & 1) ^ (ulong)pAVar6);
        pAVar5 = p->pFrames->pConst1;
        if (pAVar5 == (Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe)) {
          if (((ulong)pAVar10 & 1) == 0) {
            __assert_fail("Aig_IsComplement(pObjNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                          ,0x1b9,"int Ssw_ManSweepBmcConstr_old(Ssw_Man_t *)");
          }
        }
        else {
          Ssw_NodesAreConstrained(p,pAVar10,(Aig_Obj_t *)((ulong)pAVar5 ^ 1));
        }
      }
      pAVar3 = p->pAig;
    }
    iVar12 = iVar12 + 1;
    iVar9 = iVar9 + iVar11;
  }
  if (p->vInits->nSize != iVar9 + pAVar3->nTruePis) {
    __assert_fail("Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                  ,0x1bf,"int Ssw_ManSweepBmcConstr_old(Ssw_Man_t *)");
  }
  p->fRefined = 0;
  if (p->pPars->fVerbose == 0) {
    local_40 = (Bar_Progress_t *)0x0;
    iVar9 = 0;
  }
  else {
    local_40 = Bar_ProgressStart(_stdout,iVar11 * pAVar3->vObjs->nSize);
    iVar9 = 0;
  }
  while (iVar12 = iVar9, pSVar7 = p->pPars, iVar12 < pSVar7->nFramesK) {
    iVar9 = 0;
    while( true ) {
      pAVar3 = p->pAig;
      if (pAVar3->vObjs->nSize <= iVar9) break;
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vObjs,iVar9);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        if (p->pPars->fVerbose != 0) {
          Bar_ProgressUpdate(local_40,p->pAig->vObjs->nSize * iVar12 + iVar9,pString);
        }
        pAVar3 = p->pFrames;
        pAVar6 = Ssw_ObjChild0Fra(p,pAVar5,iVar12);
        pAVar10 = Ssw_ObjChild1Fra(p,pAVar5,iVar12);
        pAVar6 = Aig_And(pAVar3,pAVar6,pAVar10);
        iVar11 = pAVar5->Id * p->nFrames + iVar12;
        p->pNodeToFrames[iVar11] = pAVar6;
        uVar1 = Ssw_ManSweepNodeConstr(p,pAVar5,iVar12,iVar11);
        p->fRefined = p->fRefined | uVar1;
      }
      iVar9 = iVar9 + 1;
    }
    pSVar7 = p->pPars;
    if (iVar12 == pSVar7->nFramesK + -1) break;
    for (iVar9 = 0; iVar9 < pAVar3->vCos->nSize; iVar9 = iVar9 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCos,iVar9);
      pAVar6 = Ssw_ObjChild0Fra(p,pAVar5,iVar12);
      p->pNodeToFrames[pAVar5->Id * p->nFrames + iVar12] = pAVar6;
      pAVar3 = p->pAig;
    }
    for (iVar11 = 0; iVar9 = iVar12 + 1, iVar11 < pAVar3->nRegs; iVar11 = iVar11 + 1) {
      pAVar5 = Saig_ManLi(pAVar3,iVar11);
      pAVar6 = Saig_ManLo(p->pAig,iVar11);
      pAVar5 = p->pNodeToFrames[pAVar5->Id * p->nFrames + iVar12];
      p->pNodeToFrames[p->nFrames * pAVar6->Id + iVar12 + 1] = pAVar5;
      Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe));
      pAVar3 = p->pAig;
    }
  }
  if (pSVar7->fVerbose != 0) {
    Bar_ProgressStop(local_40);
  }
  aVar8 = Abc_Clock();
  p->timeBmc = p->timeBmc + (aVar8 - aVar2);
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepBmcConstr_old( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f, iLits;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // build the constraint outputs
    iLits = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            pObjNew->fPhase = Vec_IntEntry( p->vInits, iLits++ );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // build the constraint cones
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
            if ( Aig_Regular(pObjNew) == Aig_ManConst1(p->pFrames) )
            {
                assert( Aig_IsComplement(pObjNew) );
                continue;
            }
            Ssw_NodesAreConstrained( p, pObjNew, Aig_ManConst0(p->pFrames) );
        }
    }
    assert( Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );

    // sweep internal nodes
    p->fRefined = 0;
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            if ( p->pPars->fVerbose )
                Bar_ProgressUpdate( pProgress, Aig_ManObjNumMax(p->pAig) * f + i, NULL );
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}